

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpivotL.c
# Opt level: O0

int cpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int_t iVar6;
  flops_t *pfVar7;
  int_t *piVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  float ci;
  float cr;
  flops_t *ops;
  int_t *xlusup;
  singlecomplex *lusup;
  int_t *xlsub;
  int_t *lsub;
  int_t itemp;
  int_t k;
  int_t icol;
  int_t isub;
  int_t *lsub_ptr;
  singlecomplex *lu_col_ptr;
  singlecomplex *lu_sup_ptr;
  float fStack_78;
  singlecomplex temp;
  float thresh;
  float rtemp;
  float pivmax;
  int diagind;
  int diag;
  int old_pivptr;
  int pivptr;
  int_t lptr;
  int nsupr;
  int nsupc;
  int fsupc;
  singlecomplex one;
  int *pivrow_local;
  int *iperm_c_local;
  int *iperm_r_local;
  int *perm_r_local;
  int *usepr_local;
  double u_local;
  int jcol_local;
  
  nsupc = 0x3f800000;
  fsupc = 0;
  pfVar7 = stat->ops;
  piVar8 = Glu->lsub;
  pvVar9 = Glu->lusup;
  iVar3 = Glu->xsup[Glu->supno[jcol]];
  lsub._4_4_ = jcol - iVar3;
  iVar11 = Glu->xlsub[iVar3];
  iVar10 = Glu->xlsub[iVar3 + 1] - iVar11;
  iVar3 = Glu->xlusup[iVar3];
  iVar4 = Glu->xlusup[jcol];
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  iVar5 = iperm_c[jcol];
  thresh = 0.0;
  pivmax = -NAN;
  diagind = lsub._4_4_;
  diag = lsub._4_4_;
  one = (singlecomplex)pivrow;
  for (k = lsub._4_4_; k < iVar10; k = k + 1) {
    dVar12 = c_abs1((singlecomplex *)((long)pvVar9 + (long)k * 8 + (long)iVar4 * 8));
    temp.i = (float)dVar12;
    if (thresh < temp.i) {
      diag = k;
      thresh = temp.i;
    }
    if ((*usepr != 0) && (piVar8[(long)iVar11 + (long)k] == *(int *)one)) {
      diagind = k;
    }
    if (piVar8[(long)iVar11 + (long)k] == iVar5) {
      pivmax = (float)k;
    }
  }
  if ((thresh != 0.0) || (NAN(thresh))) {
    temp.r = (float)(u * (double)thresh);
    if (*usepr != 0) {
      dVar12 = c_abs1((singlecomplex *)((long)pvVar9 + (long)diagind * 8 + (long)iVar4 * 8));
      temp.i = (float)dVar12;
      if (((temp.i == 0.0) && (!NAN(temp.i))) || (temp.i < temp.r)) {
        *usepr = 0;
      }
      else {
        diag = diagind;
      }
    }
    if (*usepr == 0) {
      if (-1 < (int)pivmax) {
        dVar12 = c_abs1((singlecomplex *)((long)pvVar9 + (long)(int)pivmax * 8 + (long)iVar4 * 8));
        temp.i = (float)dVar12;
        if (((temp.i != 0.0) || (NAN(temp.i))) && (temp.r <= temp.i)) {
          diag = (int)pivmax;
        }
      }
      *(int_t *)one = piVar8[(long)iVar11 + (long)diag];
    }
    perm_r[*(int *)one] = jcol;
    if (diag != lsub._4_4_) {
      iVar6 = piVar8[(long)iVar11 + (long)diag];
      piVar8[(long)iVar11 + (long)diag] = piVar8[(long)iVar11 + (long)lsub._4_4_];
      piVar8[(long)iVar11 + (long)lsub._4_4_] = iVar6;
      for (itemp = 0; itemp <= lsub._4_4_; itemp = itemp + 1) {
        iVar11 = diag + itemp * iVar10;
        unique0x00012000 = *(undefined8 *)((long)pvVar9 + (long)iVar11 * 8 + (long)iVar3 * 8);
        *(undefined8 *)((long)pvVar9 + (long)iVar11 * 8 + (long)iVar3 * 8) =
             *(undefined8 *)
              ((long)pvVar9 + (long)(lsub._4_4_ + itemp * iVar10) * 8 + (long)iVar3 * 8);
        *(undefined8 *)((long)pvVar9 + (long)(lsub._4_4_ + itemp * iVar10) * 8 + (long)iVar3 * 8) =
             unique0x00012000;
      }
    }
    pfVar7[7] = (float)((iVar10 - lsub._4_4_) * 10) + pfVar7[7];
    c_div((singlecomplex *)((long)&lu_sup_ptr + 4),(singlecomplex *)&nsupc,
          (singlecomplex *)((long)pvVar9 + (long)lsub._4_4_ * 8 + (long)iVar4 * 8));
    while (lsub._4_4_ = lsub._4_4_ + 1, lsub._4_4_ < iVar10) {
      fVar1 = *(float *)((long)pvVar9 + (long)lsub._4_4_ * 8 + (long)iVar4 * 8 + 4);
      fVar2 = *(float *)((long)pvVar9 + (long)lsub._4_4_ * 8 + (long)iVar4 * 8);
      *(float *)((long)pvVar9 + (long)lsub._4_4_ * 8 + (long)iVar4 * 8) =
           *(float *)((long)pvVar9 + (long)lsub._4_4_ * 8 + (long)iVar4 * 8) * lu_sup_ptr._4_4_ +
           -(*(float *)((long)pvVar9 + (long)lsub._4_4_ * 8 + (long)iVar4 * 8 + 4) * fStack_78);
      *(float *)((long)pvVar9 + (long)lsub._4_4_ * 8 + (long)iVar4 * 8 + 4) =
           fVar1 * lu_sup_ptr._4_4_ + fVar2 * fStack_78;
    }
    u_local._4_4_ = 0;
  }
  else {
    *usepr = 0;
    u_local._4_4_ = jcol + 1;
  }
  return u_local._4_4_;
}

Assistant:

int
cpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    singlecomplex one = {1.0, 0.0};
    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    float       pivmax, rtemp, thresh;
    singlecomplex       temp;
    singlecomplex       *lu_sup_ptr; 
    singlecomplex       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (singlecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
        rtemp = c_abs1 (&lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = c_abs1 (&lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
            rtemp = c_abs1 (&lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += 10 * (nsupr - nsupc);

    c_div(&temp, &one, &lu_col_ptr[nsupc]);
    for (k = nsupc+1; k < nsupr; k++) 
	cc_mult(&lu_col_ptr[k], &lu_col_ptr[k], &temp);

    return 0;
}